

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall mjs::call_expression::print(call_expression *this,wostream *os)

{
  expression *peVar1;
  pointer puVar2;
  bool bVar3;
  wostream *pwVar4;
  unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *a;
  pointer puVar5;
  
  pwVar4 = std::operator<<(os,"call_expression{");
  peVar1 = (this->member_)._M_t.
           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
           super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 0x10))(peVar1,pwVar4);
  std::operator<<(pwVar4,", {");
  puVar5 = (this->arguments_).
           super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->arguments_).
           super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar2) {
    bVar3 = true;
    do {
      if (!bVar3) {
        std::operator<<(os,", ");
      }
      peVar1 = (puVar5->_M_t).
               super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
               super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
               super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
      (**(code **)((long)(peVar1->super_syntax_node)._vptr_syntax_node + 0x10))(peVar1,os);
      puVar5 = puVar5 + 1;
      bVar3 = false;
    } while (puVar5 != puVar2);
  }
  std::operator<<(os,"}}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "call_expression{" << *member_ << ", {";
        bool first = true;
        for (const auto& a: arguments_) {
            if (first) first = false;
            else os << ", ";
            os << *a;
        }
        os << "}}";
    }